

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

Vec_Int_t * Abc_NtkPowerEstimate(Abc_Ntk_t *pNtk,int fProbOne)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar5;
  Aig_Man_t *pAig_00;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int local_64;
  int i;
  Abc_Obj_t *pObjAbc2;
  Abc_Obj_t *pObjAbc;
  Aig_Obj_t *pObjAig;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkStr;
  float *pSwitching;
  float *pProbability;
  Vec_Int_t *vSwitching;
  Vec_Int_t *vProbs;
  int fProbOne_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar3 = Abc_NtkObjNumMax(pNtk);
  pVVar4 = Vec_IntStart(iVar3);
  piVar1 = pVVar4->pArray;
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  for (local_64 = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), local_64 < iVar3; local_64 = local_64 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_64);
    if ((pAVar5 != (Abc_Obj_t *)0x0) &&
       (pAVar6 = Abc_ObjRegular((pAVar5->field_6).pCopy), (*(uint *)&pAVar6->field_0x14 & 0xf) == 0)
       ) {
      (pAVar5->field_6).pTemp = (void *)0x0;
    }
  }
  iVar3 = Abc_NtkLatchNum(pNtk);
  pAig_00 = Abc_NtkToDar(pNtk_00,0,(uint)(0 < iVar3));
  p = Saig_ManComputeSwitchProbs(pAig_00,0x30,0x10,fProbOne);
  piVar2 = p->pArray;
  for (local_64 = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), local_64 < iVar3; local_64 = local_64 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_64);
    if (((pAVar5 != (Abc_Obj_t *)0x0) &&
        (pAVar6 = Abc_ObjRegular((pAVar5->field_6).pCopy), pAVar6 != (Abc_Obj_t *)0x0)) &&
       (pAVar7 = Aig_Regular((Aig_Obj_t *)(pAVar6->field_6).pCopy), pAVar7 != (Aig_Obj_t *)0x0)) {
      piVar1[pAVar5->Id] = piVar2[pAVar7->Id];
    }
  }
  Vec_IntFree(p);
  Aig_ManStop(pAig_00);
  Abc_NtkDelete(pNtk_00);
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_NtkPowerEstimate( Abc_Ntk_t * pNtk, int fProbOne )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vProbs;
    Vec_Int_t * vSwitching;
    float * pProbability;
    float * pSwitching;
    Abc_Ntk_t * pNtkStr;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Abc_Obj_t * pObjAbc, * pObjAbc2;
    int i;
    // start the resulting array
    vProbs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    pProbability = (float *)vProbs->pArray;
    // strash the network
    pNtkStr = Abc_NtkStrash( pNtk, 0, 1, 0 );
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
        if ( Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)->Type == ABC_FUNC_NONE )
            pObjAbc->pTemp = NULL;
    // map network into an AIG
    pAig = Abc_NtkToDar( pNtkStr, 0, (int)(Abc_NtkLatchNum(pNtk) > 0) );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, fProbOne );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAbc2 = Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)) && (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc2->pTemp)) )
            pProbability[pObjAbc->Id] = pSwitching[pObjAig->Id];
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    Abc_NtkDelete( pNtkStr );
    return vProbs;
}